

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O3

void av1_set_svc_seq_params(AV1_PRIMARY *ppi)

{
  uint uVar1;
  uint uVar2;
  _Bool _Var3;
  char cVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  if ((ppi->seq_params).operating_points_cnt_minus_1 == 0) {
    (ppi->seq_params).operating_point_idc[0] = 0;
    _Var3 = false;
  }
  else {
    uVar2 = ppi->number_spatial_layers;
    _Var3 = true;
    if (uVar2 != 0) {
      uVar1 = ppi->number_temporal_layers;
      uVar5 = 0;
      iVar6 = 0;
      do {
        if (uVar1 == 0) {
          uVar1 = 0;
        }
        else {
          cVar4 = '\0';
          lVar7 = 0;
          do {
            (ppi->seq_params).operating_point_idc[iVar6 + lVar7] =
                 ~(-1 << ((char)uVar1 + cVar4 & 0x1fU)) |
                 ~(-1 << ((char)ppi->number_spatial_layers - (char)uVar5 & 0x1fU)) << 8;
            uVar1 = ppi->number_temporal_layers;
            lVar7 = lVar7 + 1;
            cVar4 = cVar4 + -1;
          } while ((uint)lVar7 < uVar1);
          iVar6 = iVar6 + (uint)lVar7;
          uVar2 = ppi->number_spatial_layers;
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < uVar2);
    }
  }
  (ppi->seq_params).has_nonzero_operating_point_idc = _Var3;
  return;
}

Assistant:

void av1_set_svc_seq_params(AV1_PRIMARY *const ppi) {
  SequenceHeader *const seq = &ppi->seq_params;
  if (seq->operating_points_cnt_minus_1 == 0) {
    seq->operating_point_idc[0] = 0;
    seq->has_nonzero_operating_point_idc = false;
  } else {
    // Set operating_point_idc[] such that the i=0 point corresponds to the
    // highest quality operating point (all layers), and subsequent
    // operarting points (i > 0) are lower quality corresponding to
    // skip decoding enhancement  layers (temporal first).
    int i = 0;
    assert(seq->operating_points_cnt_minus_1 ==
           (int)(ppi->number_spatial_layers * ppi->number_temporal_layers - 1));
    for (unsigned int sl = 0; sl < ppi->number_spatial_layers; sl++) {
      for (unsigned int tl = 0; tl < ppi->number_temporal_layers; tl++) {
        seq->operating_point_idc[i] =
            (~(~0u << (ppi->number_spatial_layers - sl)) << 8) |
            ~(~0u << (ppi->number_temporal_layers - tl));
        assert(seq->operating_point_idc[i] != 0);
        i++;
      }
    }
    seq->has_nonzero_operating_point_idc = true;
  }
}